

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O3

int __thiscall SAT::findConflictLevel(SAT *this)

{
  int iVar1;
  uint uVar2;
  Clause *ps;
  ChannelInfo *pCVar3;
  long *plVar4;
  int extraout_EAX;
  int iVar5;
  Clause *this_00;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  size_t __size;
  uint uVar10;
  bool bVar11;
  
  ps = this->confl;
  uVar7 = *(uint *)ps;
  iVar5 = -1;
  if (0xff < uVar7) {
    uVar9 = 0;
    do {
      iVar1 = (this->trailpos).data[(uint)(ps->data[uVar9].x >> 1)];
      if (iVar5 < iVar1) {
        iVar5 = iVar1;
      }
      uVar9 = uVar9 + 1;
    } while (uVar7 >> 8 != uVar9);
  }
  uVar8 = (ulong)engine.trail_lim.sz;
  uVar9 = (ulong)(engine.trail_lim.sz + 1);
  do {
    bVar11 = uVar8 == 0;
    uVar8 = uVar8 - 1;
    if (bVar11) {
      uVar9 = 0;
      break;
    }
    uVar9 = (ulong)((int)uVar9 - 1);
  } while (iVar5 < engine.trail_lim.data[uVar8]);
  iVar5 = (int)uVar9;
  if ((iVar5 != 0) || (!so.sym_static)) {
    if (((uVar7 & 2) != 0) && (iVar5 < (int)((this->trail).sz - 1))) {
      __size = 8;
      if (0xff < uVar7) {
        __size = (ulong)((uVar7 >> 8) - 1) * 4 + 8;
      }
      this_00 = (Clause *)malloc(__size);
      Clause::Clause<Clause>(this_00,ps,false);
      this->confl = this_00;
      *(byte *)this_00 = *(byte *)this_00 | 2;
      vec<Clause_*>::push((this->rtrail).data + uVar9,&this->confl);
    }
    btToLevel(this,iVar5);
    return iVar5;
  }
  findConflictLevel(this);
  iVar5 = extraout_EAX;
  if (engine.trail_lim.sz != 0) {
    uVar7 = (uint)uVar8;
    uVar10 = (int)uVar7 >> 1;
    iVar5 = (this->trailpos).data[uVar10];
    if (*engine.trail_lim.data <= iVar5) {
      printf("%d:",uVar8 & 0xffffffff);
      pCVar3 = (this->c_info).data;
      uVar2 = *(uint *)(pCVar3 + uVar10);
      uVar6 = uVar2 >> 0x1d & 3;
      if (uVar6 == 2) {
        plVar4 = *(long **)((long)engine.propagators.data + (ulong)(uVar2 << 3));
        iVar5 = (**(code **)(*plVar4 + 0x40))(plVar4,pCVar3[uVar10].val,uVar7 & 1);
        return iVar5;
      }
      if (uVar6 != 1) {
        iVar5 = printf(":%d:%d, ",(ulong)(uVar7 & 1),(ulong)(uint)(this->trailpos).data[uVar10]);
        return iVar5;
      }
      printf("[v%d ",(ulong)*(uint *)(*(long *)((long)engine.vars.data + (ulong)(uVar2 * 8)) + 8));
      iVar5 = (*(code *)(&DAT_001dcc10 +
                        *(int *)(&DAT_001dcc10 + (ulong)(uVar7 & 1 ^ (int)uVar2 >> 0x1f & 3U) * 4)))
                        ();
      return iVar5;
    }
  }
  return iVar5;
}

Assistant:

int SAT::findConflictLevel() {
	int tp = -1;
	for (unsigned int i = 0; i < confl->size(); i++) {
		const int l = trailpos[var((*confl)[i])];
		if (l > tp) {
			tp = l;
		}
	}
	const int clevel = engine.tpToLevel(tp);

	if (so.sym_static && clevel == 0) {
		btToLevel(0);
		engine.async_fail = true;
		NOT_SUPPORTED;
		// need to abort analyze as well
		return 0;
	}
	assert(clevel > 0);

	// duplicate conflict clause in case it gets freed
	if (clevel < decisionLevel() && confl->temp_expl) {
		confl = Clause_new(*confl);
		confl->temp_expl = 1;
		rtrail[clevel].push(confl);
	}
	btToLevel(clevel);

	//	fprintf(stderr, "clevel = %d\n", clevel);

	if (PRINT_ANALYSIS) {
		printf("Conflict: level = %d\n", clevel);
	}

	return clevel;
}